

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

ArrayObject * Js::JavascriptArray::DeepCopyInstance(ArrayObject *arrayObject)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptArray *pJVar6;
  JavascriptNativeIntArray *instance;
  ArrayObject *pAVar7;
  JavascriptNativeFloatArray *instance_00;
  
  if (arrayObject == (ArrayObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00b9466f;
    *puVar5 = 0;
  }
  TVar1 = ((arrayObject->super_DynamicObject).super_RecyclableObject.type.ptr)->typeId;
  if (0x57 < (int)TVar1) {
    BVar4 = RecyclableObject::IsExternal((RecyclableObject *)arrayObject);
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_00b9466f;
      *puVar5 = 0;
    }
  }
  if (TVar1 == TypeIds_ArrayLast) {
    instance_00 = UnsafeVarTo<Js::JavascriptNativeFloatArray,Js::ArrayObject>(arrayObject);
    pAVar7 = (ArrayObject *)DeepCopyInstance<Js::JavascriptNativeFloatArray>(instance_00);
    return pAVar7;
  }
  if (TVar1 == TypeIds_NativeIntArray) {
    instance = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::ArrayObject>(arrayObject);
    pAVar7 = (ArrayObject *)DeepCopyInstance<Js::JavascriptNativeIntArray>(instance);
    return pAVar7;
  }
  if (TVar1 == TypeIds_Array) {
    pJVar6 = UnsafeVarTo<Js::JavascriptArray,Js::ArrayObject>(arrayObject);
    pJVar6 = DeepCopyInstance<Js::JavascriptArray>(pJVar6);
    return &pJVar6->super_ArrayObject;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar5 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                              ,0x2f63,
                              "(!\"Unexpected objectArray type while boxing stack instance\")",
                              "!\"Unexpected objectArray type while boxing stack instance\"");
  if (bVar3) {
    *puVar5 = 0;
    Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_00b9466f:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

ArrayObject* JavascriptArray::DeepCopyInstance(ArrayObject* arrayObject)
    {
        ArrayObject* arrayCopy;
        TypeId typeId = JavascriptOperators::GetTypeId(arrayObject);
        switch (typeId)
        {
        case Js::TypeIds_Array:
            arrayCopy = JavascriptArray::DeepCopyInstance<JavascriptArray>(UnsafeVarTo<JavascriptArray>(arrayObject));
            break;
        case Js::TypeIds_NativeIntArray:
            arrayCopy = JavascriptArray::DeepCopyInstance<JavascriptNativeIntArray>(UnsafeVarTo<JavascriptNativeIntArray>(arrayObject));
            break;
        case Js::TypeIds_NativeFloatArray:
            arrayCopy = JavascriptArray::DeepCopyInstance<JavascriptNativeFloatArray>(UnsafeVarTo<JavascriptNativeFloatArray>(arrayObject));
            break;

        default:
            AssertAndFailFast(!"Unexpected objectArray type while boxing stack instance");
            arrayCopy = nullptr;
        };

        return arrayCopy;
    }